

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

void proxy_http_process_queue(ProxyNegotiator *pn)

{
  BinarySink *bs;
  BinarySink *bs_00;
  ptrlen *ppVar1;
  BinarySink *s;
  long lVar2;
  ProxyNegotiatorVT *pPVar3;
  ulong uVar4;
  bufchain *pbVar5;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var6;
  InteractorVtable *pIVar7;
  ptrlen pl;
  ptrlen pl1;
  ptrlen password;
  SeatPromptResult spr_00;
  ptrlen method;
  ptrlen qop;
  ptrlen opaque;
  _Bool _Var8;
  int iVar9;
  HttpAuthType HVar10;
  int iVar11;
  uint uVar12;
  InteractionReadySeat IVar13;
  char *pcVar14;
  size_t sVar15;
  HttpAuthDetails *pHVar16;
  strbuf *psVar17;
  uintmax_t uVar18;
  prompts_t *ppVar19;
  HttpAuthType HVar20;
  ulong uVar21;
  ulong uVar22;
  HttpAuthDetails *d;
  uint32_t nonce_count;
  char cVar23;
  char cVar24;
  ulong uVar25;
  ptrlen pVar26;
  ptrlen pVar27;
  ptrlen pVar28;
  ptrlen pVar29;
  ptrlen pl_00;
  ptrlen pl_01;
  ptrlen pl_02;
  ptrlen pl_03;
  char c;
  char buf [2];
  int min_ver;
  SeatPromptResult spr;
  int maj_ver;
  char local_2c3;
  short local_2c2;
  int local_2c0;
  int local_2bc;
  void *local_2b8;
  size_t sStack_2b0;
  char *local_2a8;
  undefined8 uStack_2a0;
  char *local_298;
  undefined8 uStack_290;
  void *local_288;
  undefined8 uStack_280;
  void *local_278;
  undefined8 uStack_270;
  void *local_268;
  undefined8 uStack_260;
  SeatPromptResult local_258;
  int local_238 [130];
  
  s = pn[-2].output[0].binarysink_;
  iVar11 = *(int *)&pn[-2].output[0].binarysink_[0].write;
  if (iVar11 < 0x264) {
    if (0x1d9 < iVar11) {
      if (iVar11 != 0x1da) {
        if (iVar11 == 0x1ff) goto LAB_00109f86;
        goto LAB_0010a776;
      }
LAB_00109b28:
      _Var8 = read_line(pn->input,(strbuf *)pn[-2].output[0].binarysink_[0].writefmtv,false);
      if (!_Var8) {
        return;
      }
      iVar11 = __isoc99_sscanf(*(undefined8 *)pn[-2].output[0].binarysink_[0].writefmtv,
                               "HTTP/%d.%d %n%d",local_238,&local_2bc,&pn[-2].done,&pn[-1].ps);
      if (2 < iVar11) {
        if ((local_238[0] < 1) || ((local_238[0] == 1 && (local_2bc < 1)))) {
          *(undefined1 *)((long)&pn[-1].ps + 4) = 1;
        }
        if (*(int *)&pn[-1].ps == 0x197) {
          http_auth_details_free((HttpAuthDetails *)pn[-1].input);
          pHVar16 = http_auth_details_new();
          pn[-1].input = (bufchain *)pHVar16;
          auth_error(pHVar16,
                     "no Proxy-Authorization header seen in HTTP 407 Proxy Authentication Required response"
                    );
        }
        psVar17 = (strbuf *)pn[-2].output[0].binarysink_[0].binarysink_;
        do {
          strbuf_shrink_to(psVar17,0);
          *(undefined4 *)&s->write = 0x1ff;
LAB_00109f86:
          _Var8 = read_line(pn->input,(strbuf *)pn[-2].output[0].binarysink_[0].binarysink_,true);
          if (!_Var8) {
            return;
          }
          pn[-2].error = (char *)0x0;
          _Var8 = get_token((HttpProxyNegotiator *)s);
          if (_Var8) {
            pIVar7 = (pn[-2].itr)->vt;
            iVar11 = strcasecmp((char *)pIVar7,"Connection");
            iVar9 = strcasecmp((char *)pIVar7,"Content-Length");
            cVar23 = '\x01';
            if (iVar9 != 0) {
              cVar23 = (iVar11 != 0) * '\x05';
            }
            iVar11 = strcasecmp((char *)pIVar7,"Transfer-Encoding");
            cVar24 = '\x02';
            if (iVar11 != 0) {
              cVar24 = cVar23;
            }
            local_2c0 = strcasecmp((char *)pIVar7,"Proxy-Authenticate");
            cVar23 = '\x03';
            if (local_2c0 != 0) {
              cVar23 = cVar24;
            }
            iVar11 = strcasecmp((char *)pIVar7,"Proxy-Connection");
            cVar24 = '\x04';
            if (iVar11 != 0) {
              cVar24 = cVar23;
            }
            _Var8 = get_separator((HttpProxyNegotiator *)s,':');
            if (_Var8) {
              if (cVar24 == '\x01') {
                _Var8 = get_token((HttpProxyNegotiator *)s);
                if (_Var8) {
                  uVar18 = strtoumax((char *)(pn[-2].itr)->vt,(char **)0x0,10);
                  *(uintmax_t *)&pn[-1].done = uVar18;
                }
              }
              else if (cVar24 == '\x02') {
                _Var8 = get_token((HttpProxyNegotiator *)s);
                if (_Var8) {
                  do {
                    iVar11 = strcasecmp((char *)(pn[-2].itr)->vt,"chunked");
                    if (iVar11 == 0) {
                      pn[-1].aborted = true;
                    }
                    _Var8 = get_token((HttpProxyNegotiator *)s);
                  } while (_Var8);
                }
              }
              else if ((iVar11 == 0) || (cVar24 == '\0')) {
                _Var8 = get_token((HttpProxyNegotiator *)s);
                if (_Var8) {
                  pIVar7 = (pn[-2].itr)->vt;
                  iVar11 = strcasecmp((char *)pIVar7,"close");
                  if (iVar11 == 0) {
                    *(undefined1 *)((long)&pn[-1].ps + 4) = 1;
                  }
                  else {
                    iVar11 = strcasecmp((char *)pIVar7,"keep-alive");
                    if (iVar11 == 0) {
                      *(undefined1 *)((long)&pn[-1].ps + 4) = 0;
                    }
                  }
                }
              }
              else if (local_2c0 == 0) {
                pHVar16 = http_auth_details_new();
                pHVar16->digest_hash = HTTP_DIGEST_MD5;
                _Var8 = get_token((HttpProxyNegotiator *)s);
                if (_Var8) {
                  pIVar7 = (pn[-2].itr)->vt;
                  iVar11 = strcasecmp((char *)pIVar7,"Basic");
                  if (iVar11 != 0) {
                    iVar11 = strcasecmp((char *)pIVar7,"Digest");
                    if (iVar11 == 0) {
                      pcVar14 = "Digest authentication not supported";
                      goto LAB_0010a1bc;
                    }
                    auth_error(pHVar16,"authentication type \'%s\' not supported",pIVar7);
                    goto LAB_0010a1c6;
                  }
                  pHVar16->auth_type = AUTH_BASIC;
                  d = (HttpAuthDetails *)pn[-1].input;
                  HVar20 = d->auth_type;
                  HVar10 = AUTH_BASIC;
                  if (HVar20 != AUTH_BASIC) goto LAB_0010a202;
LAB_0010a206:
                  http_auth_details_free(d);
                  pn[-1].input = (bufchain *)pHVar16;
                }
                else {
                  pcVar14 = "parse error";
LAB_0010a1bc:
                  auth_error(pHVar16,pcVar14);
LAB_0010a1c6:
                  HVar10 = pHVar16->auth_type;
                  d = (HttpAuthDetails *)pn[-1].input;
                  HVar20 = d->auth_type;
                  if (HVar10 == HVar20) {
                    if ((HVar10 != AUTH_DIGEST) || (d->digest_hash <= pHVar16->digest_hash))
                    goto LAB_0010a206;
                  }
                  else {
LAB_0010a202:
                    if (HVar20 < HVar10) goto LAB_0010a206;
                  }
                  http_auth_details_free(pHVar16);
                }
              }
            }
          }
          psVar17 = (strbuf *)pn[-2].output[0].binarysink_[0].binarysink_;
        } while ((BinarySink *)psVar17->len != (BinarySink *)0x0);
        if (pn[-1].aborted != false) goto LAB_0010a6a1;
        *(undefined4 *)&s->write = 0x264;
        goto LAB_0010a23e;
      }
      pcVar14 = "HTTP response was absent or malformed";
LAB_00109f5a:
      pcVar14 = dupstr(pcVar14);
LAB_0010a68d:
      pn->error = pcVar14;
LAB_0010a691:
      *(undefined4 *)&pn[-2].output[0].binarysink_[0].write = 0;
      return;
    }
    if (iVar11 != 0) {
      if (iVar11 != 0x1cf) goto LAB_0010a776;
      *(undefined8 *)&pn[-1].done = 0;
      pn[-1].aborted = false;
      *(undefined1 *)((long)&pn[-1].ps + 4) = 0;
      strbuf_shrink_to((strbuf *)pn[-2].output[0].binarysink_[0].writefmtv,0);
      *(undefined4 *)&pn[-2].output[0].binarysink_[0].write = 0x1da;
      goto LAB_00109b28;
    }
    lVar2 = *(long *)&pn[-2].aborted;
    pcVar14 = conf_get_str(pn->ps->conf,0x10);
    sVar15 = strlen(pcVar14);
    pVar28.len = sVar15;
    pVar28.ptr = pcVar14;
    BinarySink_put_datapl((BinarySink *)(lVar2 + 0x18),pVar28);
    pPVar3 = pn[-1].vt;
    pcVar14 = conf_get_str(pn->ps->conf,0x11);
    sVar15 = strlen(pcVar14);
    pVar29.len = sVar15;
    pVar29.ptr = pcVar14;
    BinarySink_put_datapl((BinarySink *)&pPVar3->type,pVar29);
    if ((*(long *)(*(long *)&pn[-2].aborted + 0x10) != 0) ||
       ((pn[-1].vt)->free != (_func_void_ProxyNegotiator_ptr *)0x0)) {
      *(undefined1 *)&pn[-1].output[0].ch = 1;
    }
    sk_getaddr(pn->ps->remote_addr,(char *)local_238,0x200);
    BinarySink_put_fmt((BinarySink *)(pn[-1].output[0].binarysink_[0].write + 0x18),"%s:%d",
                       local_238,(ulong)(uint)pn->ps->remote_port);
  }
  else if (iVar11 < 0x289) {
    if (iVar11 != 0x264) {
      if (iVar11 == 0x271) goto LAB_0010a6b4;
      goto LAB_0010a776;
    }
LAB_0010a23e:
    _Var8 = bufchain_try_consume(pn->input,*(size_t *)&pn[-1].done);
    if (!_Var8) {
      return;
    }
LAB_0010a762:
    if (*(int *)&pn[-1].ps - 200U < 100) {
      pn->done = true;
LAB_0010a776:
      *(undefined4 *)&s->write = 0;
      return;
    }
    if (*(int *)&pn[-1].ps != 0x197) {
      pcVar14 = dupprintf("HTTP response %s",
                          (long)*(int *)&pn[-2].done +
                          *(long *)pn[-2].output[0].binarysink_[0].writefmtv);
      goto LAB_0010a68d;
    }
    if (*(char *)((long)&pn[-1].ps + 4) == '\x01') {
      pn->reconnect = true;
    }
    pbVar5 = pn[-1].input;
    if (*(int *)&pbVar5->head == 0) {
      pcVar14 = (char *)(pbVar5[1].head)->next;
      goto LAB_00109f5a;
    }
    if (*(char *)&pn[-1].output[0].ch == '\x01') {
      *(undefined1 *)&pn[-1].output[0].ch = 0;
    }
    else if (*(char *)((long)&pbVar5->head + 4) == '\0') {
      if (pn->itr == (Interactor *)0x0) {
        pcVar14 = "HTTP proxy requested authentication which we do not have";
        goto LAB_0010a7ff;
      }
      ppVar19 = proxy_new_prompts(pn->ps);
      pn[-1].output[0].binarysink_[0].binarysink_ = (BinarySink *)ppVar19;
      ppVar19->to_server = true;
      ppVar19->from_server = false;
      pcVar14 = dupstr("HTTP proxy authentication");
      ppVar19 = (prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_;
      ppVar19->name = pcVar14;
      if (*(long *)(*(long *)&pn[-2].aborted + 0x10) == 0) {
        *(int *)&pn[-1].itr = (int)ppVar19->n_prompts;
        pcVar14 = dupstr("Proxy username: ");
        add_prompt(ppVar19,pcVar14,true);
        ppVar19 = (prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_;
      }
      else {
        *(undefined4 *)&pn[-1].itr = 0xffffffff;
      }
      *(int *)((long)&pn[-1].itr + 4) = (int)ppVar19->n_prompts;
      pcVar14 = dupstr("Proxy password: ");
      add_prompt(ppVar19,pcVar14,false);
      goto LAB_001099e3;
    }
  }
  else {
    if (iVar11 == 0x289) goto LAB_0010a711;
    if (iVar11 == 0x28f) {
      while( true ) {
        _Var8 = bufchain_try_fetch_consume(pn->input,&local_2c2,2);
        if (!_Var8) {
          return;
        }
        if (local_2c2 != 0xa0d) break;
        if (pn[-1].error == (char *)0x0) goto LAB_0010a762;
LAB_0010a6a1:
        pn[-1].error = (char *)0x0;
        while( true ) {
          *(undefined4 *)&s->write = 0x271;
LAB_0010a6b4:
          _Var8 = bufchain_try_fetch_consume(pn->input,&local_2c3,1);
          if (!_Var8) {
            return;
          }
          iVar11 = (int)local_2c3;
          if (iVar11 == 10) break;
          if (local_2c3 != '\r') {
            if ((byte)(local_2c3 - 0x30U) < 10) {
              pcVar14 = (char *)((ulong)(iVar11 - 0x30) | (long)pn[-1].error << 4);
            }
            else {
              if ((byte)(local_2c3 + 0xbfU) < 6) {
                pcVar14 = pn[-1].error;
                uVar12 = iVar11 - 0x37;
              }
              else {
                if (5 < (byte)(local_2c3 + 0x9fU)) {
                  pcVar14 = dupprintf(
                                     "Received bad character 0x%02X in chunk length during HTTP chunked transfer encoding"
                                     );
                  goto LAB_0010a68d;
                }
                pcVar14 = pn[-1].error;
                uVar12 = iVar11 - 0x57;
              }
              pcVar14 = (char *)((ulong)uVar12 + (long)pcVar14 * 0x10);
            }
            pn[-1].error = pcVar14;
          }
        }
        *(undefined4 *)&s->write = 0x289;
LAB_0010a711:
        _Var8 = bufchain_try_consume(pn->input,(size_t)pn[-1].error);
        if (!_Var8) {
          return;
        }
        *(undefined4 *)&s->write = 0x28f;
      }
      pcVar14 = "Missing CRLF after chunk during HTTP chunked transfer encoding";
LAB_0010a7ff:
      pcVar14 = dupprintf(pcVar14);
      goto LAB_0010a68d;
    }
    if (iVar11 != 0x2e6) goto LAB_0010a776;
LAB_001099e3:
    IVar13 = interactor_announce(pn->itr);
    (*(IVar13.seat)->vt->get_userpass_input)
              (&local_258,IVar13.seat,(prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_);
    if (local_258.kind != SPRK_OK) {
      if (1 < local_258.kind - SPRK_USER_ABORT) {
        *(undefined4 *)&s->write = 0x2e6;
        return;
      }
      spr_00._4_4_ = local_258._4_4_;
      spr_00.kind = local_258.kind;
      spr_00.errfn = local_258.errfn;
      spr_00.errdata_lit = local_258.errdata_lit;
      spr_00.errdata_u = local_258.errdata_u;
      spr_00._28_4_ = local_258._28_4_;
      proxy_spr_abort(pn,spr_00);
      goto LAB_0010a691;
    }
    if (*(int *)&pn[-1].itr != -1) {
      strbuf_shrink_to(*(strbuf **)&pn[-2].aborted,0);
      lVar2 = *(long *)&pn[-2].aborted;
      pcVar14 = prompt_get_result_ref
                          (*(prompt_t **)
                            (pn[-1].output[0].binarysink_[0].binarysink_[2].writefmtv +
                            (long)*(int *)&pn[-1].itr * 8));
      sVar15 = strlen(pcVar14);
      pVar26.len = sVar15;
      pVar26.ptr = pcVar14;
      BinarySink_put_datapl((BinarySink *)(lVar2 + 0x18),pVar26);
    }
    strbuf_shrink_to((strbuf *)pn[-1].vt,0);
    pPVar3 = pn[-1].vt;
    pcVar14 = prompt_get_result_ref
                        (*(prompt_t **)
                          (pn[-1].output[0].binarysink_[0].binarysink_[2].writefmtv +
                          (long)*(int *)((long)&pn[-1].itr + 4) * 8));
    sVar15 = strlen(pcVar14);
    pVar27.len = sVar15;
    pVar27.ptr = pcVar14;
    BinarySink_put_datapl((BinarySink *)&pPVar3->type,pVar27);
    free_prompts((prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_);
    pn[-1].output[0].binarysink_[0].binarysink_ = (BinarySink *)0x0;
  }
  bs = pn->output[0].binarysink_;
  BinarySink_put_fmt(bs,"CONNECT %s HTTP/1.1\r\nHost: %s\r\n",
                     *(undefined8 *)pn[-1].output[0].binarysink_[0].write);
  iVar11 = *(int *)&(pn[-1].input)->head;
  if (iVar11 == 3) {
    pl_01.len = 0x1c;
    pl_01.ptr = "Proxy-Authorization: Digest ";
    BinarySink_put_datapl(bs,pl_01);
    pl1.ptr = (pn[-2].itr)->parent;
    pl1.len = (size_t)(pn[-2].itr)->last_to_talk;
    _Var8 = ptrlen_eq_ptrlen(pl1,*(ptrlen *)((pn[-1].input)->queue_idempotent_callback + 8));
    if (!_Var8) {
      *(undefined4 *)&pn[-1].output[0].binarysink_[0].writefmtv = 0;
    }
    pVar28 = *(ptrlen *)(*(long *)&pn[-2].aborted + 8);
    password.ptr = (pn[-1].vt)->process_queue;
    password.len = (size_t)(pn[-1].vt)->free;
    pbVar5 = pn[-1].input;
    ppVar1 = (ptrlen *)(pbVar5->buffersize + 8);
    local_268 = ppVar1->ptr;
    uStack_260 = *(undefined8 *)(pbVar5->buffersize + 0x10);
    pVar29 = *ppVar1;
    local_298 = "CONNECT";
    uStack_290 = 7;
    p_Var6 = pn[-1].output[0].binarysink_[0].write;
    ppVar1 = (ptrlen *)(p_Var6 + 8);
    local_278 = ppVar1->ptr;
    uStack_270 = *(undefined8 *)(p_Var6 + 0x10);
    pVar26 = *ppVar1;
    local_2a8 = "auth";
    uStack_2a0 = 4;
    ppVar1 = (ptrlen *)(pbVar5->queue_idempotent_callback + 8);
    local_288 = ppVar1->ptr;
    uStack_280 = *(undefined8 *)(pbVar5->queue_idempotent_callback + 0x10);
    pVar27 = *ppVar1;
    local_2b8 = (void *)0x0;
    sStack_2b0 = 0;
    if (*(char *)&pbVar5[1].tail == '\x01') {
      local_2b8 = pbVar5->ic->ctx;
      sStack_2b0 = *(size_t *)&pbVar5->ic->queued;
    }
    nonce_count = *(int *)&pn[-1].output[0].binarysink_[0].writefmtv + 1;
    *(uint32_t *)&pn[-1].output[0].binarysink_[0].writefmtv = nonce_count;
    method.len = 7;
    method.ptr = "CONNECT";
    qop.len = 4;
    qop.ptr = "auth";
    opaque.len = sStack_2b0;
    opaque.ptr = local_2b8;
    http_digest_response
              (bs,pVar28,password,pVar29,method,pVar26,qop,pVar27,opaque,nonce_count,
               *(HttpDigestHash *)&pbVar5->tail,*(_Bool *)((long)&pbVar5[1].tail + 1));
  }
  else {
    if (iVar11 != 2) goto LAB_00109f02;
    pl_00.len = 0x1b;
    pl_00.ptr = "Proxy-Authorization: Basic ";
    BinarySink_put_datapl(bs,pl_00);
    psVar17 = strbuf_new_nm();
    bs_00 = psVar17->binarysink_;
    BinarySink_put_datapl(bs_00,*(ptrlen *)(*(long *)&pn[-2].aborted + 8));
    BinarySink_put_byte(bs_00,':');
    pl.ptr = (pn[-1].vt)->process_queue;
    pl.len = (size_t)(pn[-1].vt)->free;
    BinarySink_put_datapl(bs_00,pl);
    uVar4 = psVar17->len;
    if (uVar4 != 0) {
      uVar21 = 0;
      uVar25 = uVar4;
      do {
        uVar22 = 3;
        if (uVar25 < 3) {
          uVar22 = uVar25;
        }
        base64_encode_atom(psVar17->u + uVar21,(int)uVar22,(char *)local_238);
        BinarySink_put_data(bs,local_238,4);
        uVar21 = uVar21 + 3;
        uVar25 = uVar25 - 3;
      } while (uVar21 < uVar4);
    }
    strbuf_free(psVar17);
    smemclr(local_238,4);
  }
  pl_02.len = 2;
  pl_02.ptr = "\r\n";
  BinarySink_put_datapl(bs,pl_02);
LAB_00109f02:
  pl_03.len = 2;
  pl_03.ptr = "\r\n";
  BinarySink_put_datapl(bs,pl_03);
  *(undefined4 *)&s->write = 0x1cf;
  return;
}

Assistant:

static void proxy_http_process_queue(ProxyNegotiator *pn)
{
    HttpProxyNegotiator *s = container_of(pn, HttpProxyNegotiator, pn);

    crBegin(s->crLine);

    /*
     * Initialise our username and password strbufs from the Conf.
     */
    put_dataz(s->username, conf_get_str(pn->ps->conf, CONF_proxy_username));
    put_dataz(s->password, conf_get_str(pn->ps->conf, CONF_proxy_password));
    if (s->username->len || s->password->len)
        s->try_auth_from_conf = true;

    /*
     * Set up the host:port string we're trying to connect to, also
     * used as the URI string in HTTP Digest auth.
     */
    {
        char dest[512];
        sk_getaddr(pn->ps->remote_addr, dest, lenof(dest));
        put_fmt(s->uri, "%s:%d", dest, pn->ps->remote_port);
    }

    while (true) {
        /*
         * Standard prefix for the HTTP CONNECT request.
         */
        put_fmt(pn->output,
                "CONNECT %s HTTP/1.1\r\n"
                "Host: %s\r\n", s->uri->s, s->uri->s);

        /*
         * Add an auth header, if we're planning to this time round.
         */
        if (s->next_auth->auth_type == AUTH_BASIC) {
            put_datalit(pn->output, "Proxy-Authorization: Basic ");

            strbuf *base64_input = strbuf_new_nm();
            put_datapl(base64_input, ptrlen_from_strbuf(s->username));
            put_byte(base64_input, ':');
            put_datapl(base64_input, ptrlen_from_strbuf(s->password));

            char base64_output[4];
            for (size_t i = 0, e = base64_input->len; i < e; i += 3) {
                base64_encode_atom(base64_input->u + i,
                                   e-i > 3 ? 3 : e-i, base64_output);
                put_data(pn->output, base64_output, 4);
            }
            strbuf_free(base64_input);
            smemclr(base64_output, sizeof(base64_output));
            put_datalit(pn->output, "\r\n");
        } else if (s->next_auth->auth_type == AUTH_DIGEST) {
            put_datalit(pn->output, "Proxy-Authorization: Digest ");

            /* If we have a fresh nonce, reset the
             * nonce count. Otherwise, keep incrementing it. */
            if (!ptrlen_eq_ptrlen(ptrlen_from_strbuf(s->token),
                                  ptrlen_from_strbuf(s->next_auth->nonce)))
                s->nonce_count = 0;

            http_digest_response(BinarySink_UPCAST(pn->output),
                                 ptrlen_from_strbuf(s->username),
                                 ptrlen_from_strbuf(s->password),
                                 ptrlen_from_strbuf(s->next_auth->realm),
                                 PTRLEN_LITERAL("CONNECT"),
                                 ptrlen_from_strbuf(s->uri),
                                 PTRLEN_LITERAL("auth"),
                                 ptrlen_from_strbuf(s->next_auth->nonce),
                                 (s->next_auth->got_opaque ?
                                  ptrlen_from_strbuf(s->next_auth->opaque) :
                                  make_ptrlen(NULL, 0)),
                                 ++s->nonce_count, s->next_auth->digest_hash,
                                 s->next_auth->hash_username);
            put_datalit(pn->output, "\r\n");
        }

        /*
         * Blank line to terminate the HTTP request.
         */
        put_datalit(pn->output, "\r\n");
        crReturnV;

        s->content_length = 0;
        s->chunked_transfer = false;
        s->connection_close = false;

        /*
         * Read and parse the HTTP status line, and check if it's a 2xx
         * for success.
         */
        strbuf_clear(s->response);
        crMaybeWaitUntilV(read_line(pn->input, s->response, false));
        {
            int maj_ver, min_ver, n_scanned;
            n_scanned = sscanf(
                s->response->s, "HTTP/%d.%d %n%d",
                &maj_ver, &min_ver, &s->http_status_pos, &s->http_status);

            if (n_scanned < 3) {
                pn->error = dupstr("HTTP response was absent or malformed");
                crStopV;
            }

            if (maj_ver < 1 || (maj_ver == 1 && min_ver < 1)) {
                /* Before HTTP/1.1, connections close by default */
                s->connection_close = true;
            }
        }

        if (s->http_status == 407) {
            /*
             * If this is going to be an auth request, we expect to
             * see at least one Proxy-Authorization header offering us
             * auth options. Start by preloading s->next_auth with a
             * fallback error message, which will be used if nothing
             * better is available.
             */
            http_auth_details_free(s->next_auth);
            s->next_auth = http_auth_details_new();
            auth_error(s->next_auth, "no Proxy-Authorization header seen in "
                       "HTTP 407 Proxy Authentication Required response");
        }

        /*
         * Read the HTTP response header section.
         */
        do {
            strbuf_clear(s->header);
            crMaybeWaitUntilV(read_line(pn->input, s->header, true));
            s->header_pos = 0;

            if (!get_token(s)) {
                /* Possibly we ought to panic if we see an HTTP header
                 * we can't make any sense of at all? But whatever,
                 * ignore it and hope the next one makes more sense */
                continue;
            }

            /* Parse the header name */
            HttpHeader hdr = HDR_UNKNOWN;
            {
                #define CHECK_HEADER(id, string) \
                    if (!stricmp(s->token->s, string)) hdr = id;
                HTTP_HEADER_LIST(CHECK_HEADER);
                #undef CHECK_HEADER
            }

            if (!get_separator(s, ':'))
                continue;

            if (hdr == HDR_CONTENT_LENGTH) {
                if (!get_token(s))
                    continue;
                s->content_length = strtoumax(s->token->s, NULL, 10);
            } else if (hdr == HDR_TRANSFER_ENCODING) {
                /*
                 * The Transfer-Encoding header value should be a
                 * comma-separated list of keywords including
                 * "chunked", "deflate" and "gzip". We parse it in the
                 * most superficial way, by just looking for "chunked"
                 * and ignoring everything else.
                 *
                 * It's OK to do that because we're not actually
                 * _using_ the error document - we only have to skip
                 * over it to find the end of the HTTP response. So we
                 * don't care if it's gzipped or not.
                 */
                while (get_token(s)) {
                    if (!stricmp(s->token->s, "chunked"))
                        s->chunked_transfer = true;
                }
            } else if (hdr == HDR_CONNECTION ||
                       hdr == HDR_PROXY_CONNECTION) {
                if (!get_token(s))
                    continue;
                if (!stricmp(s->token->s, "close"))
                    s->connection_close = true;
                else if (!stricmp(s->token->s, "keep-alive"))
                    s->connection_close = false;
            } else if (hdr == HDR_PROXY_AUTHENTICATE) {
                HttpAuthDetails *auth = parse_http_auth_header(s);

                /*
                 * See if we prefer this set of auth details to the
                 * previous one we had (either from a previous auth
                 * header, or the fallback when no auth header is
                 * provided at all).
                 */
                bool change;

                if (auth->auth_type != s->next_auth->auth_type) {
                    /* Use the preference order implied by the enum */
                    change = auth->auth_type > s->next_auth->auth_type;
                } else if (auth->auth_type == AUTH_DIGEST &&
                           auth->digest_hash != s->next_auth->digest_hash) {
                    /* Choose based on the hash functions */
                    change = auth->digest_hash > s->next_auth->digest_hash;
                } else {
                    /*
                     * If in doubt, go with the later one of the
                     * headers.
                     *
                     * The main reason for this is so that an error in
                     * interpreting an auth header will supersede the
                     * default error we preload saying 'no header
                     * found', because that would be a particularly
                     * bad error to report if there _was_ one.
                     *
                     * But we're in a tie-breaking situation by now,
                     * so there's no other reason to choose - we might
                     * as well apply the same policy everywhere else
                     * too.
                     */
                    change = true;
                }

                if (change) {
                    http_auth_details_free(s->next_auth);
                    s->next_auth = auth;
                } else {
                    http_auth_details_free(auth);
                }
            }
        } while (s->header->len > 0);

        /* Read and ignore the entire response document */
        if (!s->chunked_transfer) {
            /* Simple approach: read exactly Content-Length bytes */
            crMaybeWaitUntilV(bufchain_try_consume(
                                  pn->input, s->content_length));
        } else {
            /* Chunked transfer: read a sequence of
             * <hex length>\r\n<data>\r\n chunks, terminating in one with
             * zero length */
            do {
                /*
                 * Expect a chunk length
                 */
                s->chunk_length = 0;
                while (true) {
                    char c;
                    crMaybeWaitUntilV(bufchain_try_fetch_consume(
                                          pn->input, &c, 1));
                    if (c == '\r') {
                        continue;
                    } else if (c == '\n') {
                        break;
                    } else if ('0' <= c && c <= '9') {
                        s->chunk_length = s->chunk_length*16 + (c-'0');
                    } else if ('A' <= c && c <= 'F') {
                        s->chunk_length = s->chunk_length*16 + (c-'A'+10);
                    } else if ('a' <= c && c <= 'f') {
                        s->chunk_length = s->chunk_length*16 + (c-'a'+10);
                    } else {
                        pn->error = dupprintf(
                            "Received bad character 0x%02X in chunk length "
                            "during HTTP chunked transfer encoding",
                            (unsigned)(unsigned char)c);
                        crStopV;
                    }
                }

                /*
                 * Expect that many bytes of chunked data
                 */
                crMaybeWaitUntilV(bufchain_try_consume(
                                      pn->input, s->chunk_length));

                /* Now expect \r\n */
                {
                    char buf[2];
                    crMaybeWaitUntilV(bufchain_try_fetch_consume(
                                          pn->input, buf, 2));
                    if (memcmp(buf, "\r\n", 2)) {
                        pn->error = dupprintf(
                            "Missing CRLF after chunk "
                            "during HTTP chunked transfer encoding");
                        crStopV;
                    }
                }
            } while (s->chunk_length);
        }

        if (200 <= s->http_status && s->http_status < 300) {
            /* Any 2xx HTTP response means we're done */
            goto authenticated;
        } else if (s->http_status == 407) {
            /* 407 is Proxy Authentication Required, which we may be
             * able to do something about. */
            if (s->connection_close) {
                /* If we got 407 + connection closed, reconnect before
                 * sending our next request. */
                pn->reconnect = true;
            }

            /* If the best we can do is report some kind of error from
             * a Proxy-Auth header (or an error saying there wasn't
             * one at all), and no successful parsing of an auth
             * header superseded that, then just throw that error and
             * die. */
            if (s->next_auth->auth_type == AUTH_ERROR) {
                pn->error = dupstr(s->next_auth->error->s);
                crStopV;
            }

            /* If we have auth details from the Conf and haven't tried
             * them yet, that's our first step. */
            if (s->try_auth_from_conf) {
                s->try_auth_from_conf = false;
                continue;
            }

            /* If the server sent us stale="true" in a Digest auth
             * header, that means we _don't_ need to request a new
             * password yet; just try again with the existing details
             * and the fresh nonce it sent us. */
            if (s->next_auth->digest_nonce_was_stale)
                continue;

            /* Either we never had a password in the first place, or
             * the one we already presented was rejected. We can only
             * proceed from here if we have a way to ask the user
             * questions. */
            if (!pn->itr) {
                pn->error = dupprintf("HTTP proxy requested authentication "
                                      "which we do not have");
                crStopV;
            }

            /*
             * Send some prompts to the user. We'll assume the
             * password is always required (since it's just been
             * rejected, even if we did send one before), and we'll
             * prompt for the username only if we don't have one from
             * the Conf.
             */
            s->prompts = proxy_new_prompts(pn->ps);
            s->prompts->to_server = true;
            s->prompts->from_server = false;
            s->prompts->name = dupstr("HTTP proxy authentication");
            if (!s->username->len) {
                s->username_prompt_index = s->prompts->n_prompts;
                add_prompt(s->prompts, dupstr("Proxy username: "), true);
            } else {
                s->username_prompt_index = -1;
            }

            s->password_prompt_index = s->prompts->n_prompts;
            add_prompt(s->prompts, dupstr("Proxy password: "), false);

            while (true) {
                SeatPromptResult spr = seat_get_userpass_input(
                    interactor_announce(pn->itr), s->prompts);
                if (spr.kind == SPRK_OK) {
                    break;
                } else if (spr_is_abort(spr)) {
                    proxy_spr_abort(pn, spr);
                    crStopV;
                }
                crReturnV;
            }

            if (s->username_prompt_index != -1) {
                strbuf_clear(s->username);
                put_dataz(s->username,
                          prompt_get_result_ref(
                              s->prompts->prompts[s->username_prompt_index]));
            }

            strbuf_clear(s->password);
            put_dataz(s->password,
                      prompt_get_result_ref(
                          s->prompts->prompts[s->password_prompt_index]));

            free_prompts(s->prompts);
            s->prompts = NULL;
        } else {
            /* Any other HTTP response is treated as permanent failure */
            pn->error = dupprintf("HTTP response %s",
                                  s->response->s + s->http_status_pos);
            crStopV;
        }
    }

  authenticated:
    /*
     * Success! Hand over to the main connection.
     */
    pn->done = true;

    crFinishV;
}